

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

double __thiscall
Trainer::Trainer<Kuhn::Game>::chanceSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  Trainer<Kuhn::Game> *this_00;
  int iVar2;
  undefined4 action;
  undefined8 po_00;
  bool bVar3;
  uint actionNum_00;
  double *strategy_00;
  double dVar4;
  undefined8 uStack_240;
  undefined1 auStack_238 [8];
  double local_230;
  double local_228;
  double local_220;
  undefined1 *local_218;
  double *local_210;
  Node *local_208;
  mapped_type *local_200;
  Node *local_1f8;
  mapped_type *local_1f0;
  Trainer<Kuhn::Game> *local_1e8;
  result_type local_1dc;
  double *local_1d8;
  mapped_type *local_1d0;
  int local_1c8;
  uint local_1c4;
  Trainer<Kuhn::Game> *local_1c0;
  double local_1b8;
  double regretSum;
  double regret;
  undefined1 local_1a0 [4];
  int a_1;
  Game game_cp_1;
  Trainer<Kuhn::Game> *pTStack_138;
  int a;
  double nodeUtil;
  unsigned_long __vla_expr0;
  double *strategy;
  Node *node;
  undefined1 local_108 [8];
  discrete_distribution<int> dist;
  double *strategy_1;
  Game game_cp;
  int player;
  undefined1 local_58 [4];
  int actionNum;
  string infoSet;
  double po_local;
  double pi_local;
  int playerIndex_local;
  Game *game_local;
  Trainer<Kuhn::Game> *this_local;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  uStack_240 = 0x126ef6;
  local_1c0 = this;
  infoSet.field_2._8_8_ = po;
  bVar3 = Kuhn::Game::done(game);
  if (bVar3) {
    uStack_240 = 0x126f08;
    this_local = (Trainer<Kuhn::Game> *)Kuhn::Game::payoff(game,playerIndex);
  }
  else {
    uStack_240 = 0x126f1f;
    Kuhn::Game::infoSetStr_abi_cxx11_((string *)local_58,game);
    uStack_240 = 0x126f28;
    actionNum_00 = Kuhn::Game::actionNum(game);
    uStack_240 = 0x126f42;
    local_1c4 = actionNum_00;
    local_1c8 = Kuhn::Game::currentPlayer(game);
    game_cp._88_4_ = local_1c8;
    if ((local_1c0->mUpdate[local_1c8] & 1U) == 0) {
      uStack_240 = 0x126f7f;
      Kuhn::Game::Game((Game *)&strategy_1,game);
      uStack_240 = 0x126fa3;
      local_1d0 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                  ::at(local_1c0->mFixedStrategies + (int)game_cp._88_4_,(key_type *)local_58);
      uStack_240 = 0x126fbb;
      local_1d8 = Node::averageStrategy(*local_1d0);
      uStack_240 = 0x126fed;
      dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1d8;
      std::discrete_distribution<int>::discrete_distribution<double_const*>
                ((discrete_distribution<int> *)local_108,local_1d8,local_1d8 + (int)actionNum_00);
      uStack_240 = 0x127002;
      local_1dc = std::discrete_distribution<int>::operator()
                            ((discrete_distribution<int> *)local_108,&local_1c0->mEngine);
      uStack_240 = 0x12701c;
      Kuhn::Game::step((Game *)&strategy_1,local_1dc);
      uStack_240 = 0x12703e;
      this_local = (Trainer<Kuhn::Game> *)
                   chanceSamplingCFR(local_1c0,(Game *)&strategy_1,playerIndex,pi,
                                     (double)infoSet.field_2._8_8_);
      uStack_240 = 0x12706b;
      local_1e8 = this_local;
      std::discrete_distribution<int>::~discrete_distribution
                ((discrete_distribution<int> *)local_108);
    }
    else {
      uStack_240 = 0x1270b5;
      local_1f0 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                  ::operator[](&local_1c0->mNodeMap,(key_type *)local_58);
      strategy = (double *)*local_1f0;
      if ((mapped_type)strategy == (mapped_type)0x0) {
        uStack_240 = 0x1270e7;
        local_1f8 = (Node *)operator_new(0x30);
        uStack_240 = 0x1270ff;
        Node::Node(local_1f8,actionNum_00);
        strategy = (double *)local_1f8;
        local_208 = local_1f8;
        uStack_240 = 0x127134;
        local_200 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                    ::operator[](&local_1c0->mNodeMap,(key_type *)local_58);
        *local_200 = local_208;
      }
      uStack_240 = 0x12717e;
      strategy_00 = Node::strategy((Node *)strategy);
      lVar1 = -((ulong)actionNum_00 * 8 + 0xf & 0xfffffffffffffff0);
      local_218 = auStack_238 + lVar1;
      pTStack_138 = (Trainer<Kuhn::Game> *)0x0;
      local_210 = strategy_00;
      for (game_cp_1._92_4_ = 0; (int)game_cp_1._92_4_ < (int)actionNum_00;
          game_cp_1._92_4_ = game_cp_1._92_4_ + 1) {
        *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x1271f9;
        Kuhn::Game::Game((Game *)local_1a0,game);
        action = game_cp_1._92_4_;
        *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x12720d;
        Kuhn::Game::step((Game *)local_1a0,action);
        po_00 = infoSet.field_2._8_8_;
        this_00 = local_1c0;
        if (game_cp._88_4_ == playerIndex) {
          dVar4 = strategy_00[(int)game_cp_1._92_4_];
          *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x12724e;
          dVar4 = chanceSamplingCFR(this_00,(Game *)local_1a0,playerIndex,pi * dVar4,(double)po_00);
          *(double *)(local_218 + (long)(int)game_cp_1._92_4_ * 8) = dVar4;
          local_220 = dVar4;
        }
        else {
          dVar4 = (double)infoSet.field_2._8_8_ * strategy_00[(int)game_cp_1._92_4_];
          *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x1272ac;
          dVar4 = chanceSamplingCFR(this_00,(Game *)local_1a0,playerIndex,pi,dVar4);
          *(double *)(local_218 + (long)(int)game_cp_1._92_4_ * 8) = dVar4;
          local_228 = dVar4;
        }
        pTStack_138 = (Trainer<Kuhn::Game> *)
                      (strategy_00[(int)game_cp_1._92_4_] *
                       *(double *)(local_218 + (long)(int)game_cp_1._92_4_ * 8) +
                      (double)pTStack_138);
      }
      if (game_cp._88_4_ == playerIndex) {
        for (regret._4_4_ = 0; iVar2 = regret._4_4_, regret._4_4_ < (int)actionNum_00;
            regret._4_4_ = regret._4_4_ + 1) {
          regretSum = *(double *)(local_218 + (long)regret._4_4_ * 8) - (double)pTStack_138;
          *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x127381;
          local_230 = Node::regretSum((Node *)strategy,iVar2);
          iVar2 = regret._4_4_;
          dVar4 = (double)infoSet.field_2._8_8_ * regretSum + local_230;
          local_1b8 = dVar4;
          *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x1273ca;
          Node::regretSum((Node *)strategy,iVar2,dVar4);
        }
        *(undefined8 *)(auStack_238 + lVar1 + -8) = 0x1273fa;
        Node::strategySum((Node *)strategy,strategy_00,pi);
      }
      this_local = pTStack_138;
    }
    uStack_240 = 0x127428;
    std::__cxx11::string::~string((string *)local_58);
  }
  return (double)this_local;
}

Assistant:

double Trainer<T>::chanceSamplingCFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        auto game_cp(game);
        auto strategy = mFixedStrategies[player].at(infoSet)->averageStrategy();
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        return chanceSamplingCFR(game_cp, playerIndex, pi, po);
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}